

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZCompMesh *mesh,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *copy)

{
  TPZVec<long> *in_RDI;
  int64_t in_stack_00000008;
  TPZManVector<TPZCompElSide,_5> *in_stack_00000010;
  TPZIntCube3D *copy_00;
  TPZIntCube3D *this_00;
  pointer_____offset_0x60___ *copy_01;
  TPZMultiphysicsElement *in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **vtt;
  TPZMultiphysicsElement *this_01;
  
  this_01 = (TPZMultiphysicsElement *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy_01 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02502530);
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (this_01,vtt,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZMultiphysicsCompEl_025021f8;
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZMultiphysicsCompEl_025021f8;
  this_00 = (TPZIntCube3D *)&in_RDI[3].fNAlloc;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(in_stack_00000010,in_stack_00000008);
  copy_00 = (TPZIntCube3D *)&in_RDI[7].fStore;
  TPZVec<long>::TPZVec(in_RDI,(TPZVec<long> *)copy_01);
  TPZIntCube3D::TPZIntCube3D(this_00,copy_00);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh, const TPZMultiphysicsCompEl<TGeometry> &copy) : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(mesh,copy),
fConnectIndexes(copy.fConnectIndexes),  fIntRule(copy.fIntRule)
{
#ifdef PZDEBUG
    TPZMaterial * material = Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
#endif
    
}